

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

EnumSchema __thiscall capnp::Schema::asEnum(Schema *this)

{
  bool bVar1;
  Reader local_98;
  ArrayPtr<const_char> local_68;
  Fault local_58;
  Fault f;
  bool local_1a;
  DebugExpression<bool> local_19;
  Schema *pSStack_18;
  DebugExpression<bool> _kjCondition;
  Schema *this_local;
  
  pSStack_18 = this;
  getProto((Reader *)&f,this);
  local_1a = capnp::schema::Node::Reader::isEnum((Reader *)&f);
  local_19 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_19);
  if (bVar1) {
    EnumSchema::EnumSchema((EnumSchema *)&this_local,(Schema)this->raw);
  }
  else {
    getProto(&local_98,this);
    local_68 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_98);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41],capnp::Text::Reader>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x123,FAILED,"getProto().isEnum()",
               "_kjCondition,\"Tried to use non-enum schema as an enum.\", getProto().getDisplayName()"
               ,&local_19,(char (*) [41])"Tried to use non-enum schema as an enum.",
               (Reader *)&local_68);
    EnumSchema::EnumSchema((EnumSchema *)&this_local);
    kj::_::Debug::Fault::~Fault(&local_58);
  }
  return (EnumSchema)(Schema)this_local;
}

Assistant:

EnumSchema Schema::asEnum() const {
  KJ_REQUIRE(getProto().isEnum(), "Tried to use non-enum schema as an enum.",
             getProto().getDisplayName()) {
    return EnumSchema();
  }
  return EnumSchema(*this);
}